

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O0

xcb_window_t create_supporting_window(natwm_state *state)

{
  xcb_window_t xVar1;
  undefined4 uVar2;
  xcb_window_t win;
  natwm_state *state_local;
  
  uVar2 = 0;
  xVar1 = xcb_generate_id(state->xcb);
  xcb_create_window(state->xcb,0,xVar1,state->screen->root,0xffffffff,0xffffffff,CONCAT44(uVar2,1),1
                    ,0,0,state->screen->root_visual,0,0);
  return xVar1;
}

Assistant:

static xcb_window_t create_supporting_window(const struct natwm_state *state)
{
        xcb_window_t win = xcb_generate_id(state->xcb);

        xcb_create_window(state->xcb,
                          XCB_COPY_FROM_PARENT,
                          win,
                          state->screen->root,
                          -1,
                          -1,
                          1,
                          1,
                          0,
                          XCB_COPY_FROM_PARENT,
                          state->screen->root_visual,
                          0,
                          NULL);

        return win;
}